

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  ulong in_RSI;
  buffer<unsigned_int> *in_RDI;
  int num_bigits;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  int local_14;
  ulong local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  do {
    uVar2 = (uint)local_10;
    puVar1 = buffer<unsigned_int>::operator[](in_RDI,(long)local_14);
    *puVar1 = uVar2;
    local_10 = local_10 >> 0x20;
    local_14 = local_14 + 1;
  } while (local_10 != 0);
  buffer<unsigned_int>::resize(in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  *(undefined4 *)&in_RDI[5]._vptr_buffer = 0;
  return;
}

Assistant:

void assign(uint64_t n) {
    int num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }